

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usbcam.cpp
# Opt level: O1

void frame(void)

{
  uchar *puVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  int extraout_EAX;
  int *piVar5;
  timeval tv;
  fd_set fds;
  timeval local_128;
  ulong local_118 [12];
  fd_set local_b8;
  
  do {
    while( true ) {
      local_b8.fds_bits[0] = 0;
      local_b8.fds_bits[1] = 0;
      local_b8.fds_bits[2] = 0;
      local_b8.fds_bits[3] = 0;
      local_b8.fds_bits[4] = 0;
      local_b8.fds_bits[5] = 0;
      local_b8.fds_bits[6] = 0;
      local_b8.fds_bits[7] = 0;
      local_b8.fds_bits[8] = 0;
      local_b8.fds_bits[9] = 0;
      local_b8.fds_bits[10] = 0;
      local_b8.fds_bits[0xb] = 0;
      local_b8.fds_bits[0xc] = 0;
      local_b8.fds_bits[0xd] = 0;
      local_b8.fds_bits[0xe] = 0;
      local_b8.fds_bits[0xf] = 0;
      iVar3 = fd + 0x3f;
      if (-1 < fd) {
        iVar3 = fd;
      }
      local_b8.fds_bits[iVar3 >> 6] =
           local_b8.fds_bits[iVar3 >> 6] | 1L << ((byte)(fd % 0x40) & 0x3f);
      local_128.tv_sec = 2;
      local_128.tv_usec = 0;
      iVar3 = select(fd + 1,&local_b8,(fd_set *)0x0,(fd_set *)0x0,&local_128);
      if (iVar3 == -1) break;
      if (iVar3 == 0) {
        frame();
        goto LAB_00117ffc;
      }
      read_frame()::count = read_frame()::count + 1;
      printf("%d\n");
      local_118[1] = 0;
      local_118[6] = 0;
      local_118[2] = 0;
      local_118[3] = 0;
      local_118[4] = 0;
      local_118[5] = 0;
      local_118[8] = 0;
      local_118[9] = 0;
      local_118[10] = 0;
      local_118[0] = 0x100000000;
      local_118[7] = 0x100000000;
      iVar3 = xioctl(fd,-0x3fa7a9ef,local_118);
      if (iVar3 == -1) {
        piVar5 = __errno_location();
        if (*piVar5 != 0xb) {
LAB_00118033:
          errno_exit("VIDIOC_DQBUF");
          iVar4 = extraout_EAX;
LAB_0011803f:
          std::__throw_system_error(iVar4);
        }
      }
      else {
        if (n_buffers <= (uint)local_118[0]) goto LAB_00118008;
        puVar1 = (uchar *)buffers[local_118[0] & 0xffffffff].start;
        if (Webcam::isStreamMode == true) {
          sVar2 = buffers[local_118[0] & 0xffffffff].length;
          iVar4 = pthread_mutex_lock((pthread_mutex_t *)&imgLock);
          if (iVar4 != 0) goto LAB_0011803f;
          imgBuffer[1 - (long)readyImgPos].data = puVar1;
          imgBuffer[1 - (long)readyImgPos].size = (int)sVar2;
          readyImgPos = 1 - readyImgPos;
          pthread_mutex_unlock((pthread_mutex_t *)&imgLock);
          puVar1 = imgBuffer[0].data;
        }
        imgBuffer[0].data = puVar1;
        iVar4 = xioctl(fd,-0x3fa7a9f1,local_118);
        if (iVar4 == -1) {
          errno_exit("VIDIOC_QBUF");
          goto LAB_00118033;
        }
      }
      if (iVar3 != -1) {
        return;
      }
    }
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
LAB_00117ffc:
  errno_exit("select");
LAB_00118008:
  __assert_fail("buf.index < n_buffers",
                "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]usbcam/usbcam.cpp"
                ,0x8d,"int read_frame()");
}

Assistant:

static void
frame                        (void)
{
    for (;;) {
        fd_set fds;
        struct timeval tv;
        int r;

        FD_ZERO (&fds);
        FD_SET (fd, &fds);

        /* Timeout. */
        tv.tv_sec = 2;
        tv.tv_usec = 0;

        r = select (fd + 1, &fds, NULL, NULL, &tv);

        if (-1 == r) {
            if (EINTR == errno)
                continue;

            errno_exit ("select");
        }

        if (0 == r) {
            fprintf (stderr, "select timeout\n");
            errno_exit (EXIT_FAILURE);
        }

        if (read_frame ())
            break;

        /* EAGAIN - continue select loop. */
    }
}